

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

long CVariableInt::Decompress(void *pSrc_,int SrcSize,void *pDst_,int DstSize)

{
  uchar *puVar1;
  int *pInOut;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/compression.cpp"
                 ,0x42,(uint)(((long)DstSize & 3U) == 0),"invalid bounds");
  pInOut = (int *)pDst_;
  if (0 < SrcSize) {
    puVar1 = (uchar *)((long)SrcSize + (long)pSrc_);
    do {
      if ((int *)(((long)DstSize & 0xfffffffffffffffcU) + (long)pDst_) <= pInOut) {
        return -1;
      }
      pSrc_ = Unpack((uchar *)pSrc_,pInOut);
      pInOut = pInOut + 1;
    } while (pSrc_ < puVar1);
  }
  return (long)pInOut - (long)pDst_;
}

Assistant:

long CVariableInt::Decompress(const void *pSrc_, int SrcSize, void *pDst_, int DstSize)
{
	dbg_assert(DstSize % sizeof(int) == 0, "invalid bounds");

	const unsigned char *pSrc = (unsigned char *)pSrc_;
	const unsigned char *pEnd = pSrc + SrcSize;
	int *pDst = (int *)pDst_;
	const int *pDstEnd = pDst + DstSize / sizeof(int);
	while(pSrc < pEnd)
	{
		if(pDst >= pDstEnd)
			return -1;
		pSrc = CVariableInt::Unpack(pSrc, pDst);
		pDst++;
	}
	return (long)((unsigned char *)pDst - (unsigned char *)pDst_);
}